

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::OperatorModuloFun::GetFunctions(void)

{
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  vector<duckdb::ScalarFunction,_true> *this;
  ScalarFunction *func;
  pointer function;
  ScalarFunctionSet *in_RDI;
  pointer other;
  long lVar2;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  undefined4 in_stack_fffffffffffff9c4;
  undefined4 in_stack_fffffffffffff9cc;
  FunctionNullHandling in_stack_fffffffffffff9d8;
  allocator_type local_621;
  LogicalType local_610 [2];
  _Any_data *local_5e0;
  _Any_data *local_5d8;
  _Any_data *local_5d0;
  _Any_data local_5c8;
  code *local_5b8;
  undefined8 uStack_5b0;
  _Any_data local_5a8;
  code *local_598;
  undefined8 uStack_590;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_588;
  _Any_data local_570;
  code *local_560;
  LogicalType local_550;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_538;
  LogicalType local_520;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_508;
  LogicalType local_4f0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_4d8;
  LogicalType local_4c0;
  LogicalType local_4a8;
  LogicalType local_490;
  string local_478;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"%","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_478);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p);
  }
  LogicalType::Numeric();
  if (local_588.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_588.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
    local_5d8 = (_Any_data *)&local_330.function;
    local_5d0 = (_Any_data *)&local_208.function;
    local_5e0 = (_Any_data *)&local_458.function;
    other = local_588.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start;
    do {
      if (other->id_ - 0x16 < 2) {
        LogicalType::LogicalType(local_610,other);
        LogicalType::LogicalType(local_610 + 1,other);
        __l._M_len = 2;
        __l._M_array = local_610;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_4d8,__l,&local_621);
        LogicalType::LogicalType(&local_4f0,other);
        local_598 = (code *)0x0;
        uStack_590 = 0;
        local_5a8._M_unused._M_object = (void *)0x0;
        local_5a8._8_8_ = 0;
        LogicalType::LogicalType(&local_490,INVALID);
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs._0_8_ = &local_490;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffff9c4;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffff9cc;
        ScalarFunction::ScalarFunction
                  (&local_208,(vector<duckdb::LogicalType,_true> *)&local_4d8,&local_4f0,
                   (scalar_function_t *)&local_5a8,BindBinaryFloatingPoint<duckdb::ModuloOperator>,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffff9d8,
                   (bind_lambda_function_t)in_RDI);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&this->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_208);
        local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_01993078;
        if (local_208.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_208.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_208.function.super__Function_base._M_manager)
                    (local_5d0,local_5d0,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
        LogicalType::~LogicalType(&local_490);
        if (local_598 != (code *)0x0) {
          (*local_598)(&local_5a8,&local_5a8,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_4f0);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_4d8);
        lVar2 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(&local_610[0].id_ + lVar2));
          lVar2 = lVar2 + -0x18;
        } while (lVar2 != -0x18);
      }
      else if (other->id_ == DECIMAL) {
        LogicalType::LogicalType(local_610,other);
        LogicalType::LogicalType(local_610 + 1,other);
        __l_00._M_len = 2;
        __l_00._M_array = local_610;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_508,__l_00,&local_621);
        LogicalType::LogicalType(&local_520,other);
        local_5b8 = (code *)0x0;
        uStack_5b0 = 0;
        local_5c8._M_unused._M_object = (void *)0x0;
        local_5c8._8_8_ = 0;
        LogicalType::LogicalType(&local_4a8,INVALID);
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_00._0_8_ = &local_4a8;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffff9c4;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffff9cc;
        ScalarFunction::ScalarFunction
                  (&local_330,(vector<duckdb::LogicalType,_true> *)&local_508,&local_520,
                   (scalar_function_t *)&local_5c8,BindDecimalModulo<duckdb::ModuloOperator>,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs_00,CONSISTENT,in_stack_fffffffffffff9d8,
                   (bind_lambda_function_t)in_RDI);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&this->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_330);
        local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_01993078;
        if (local_330.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_330.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_330.function.super__Function_base._M_manager)
                    (local_5d8,local_5d8,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
        LogicalType::~LogicalType(&local_4a8);
        if (local_5b8 != (code *)0x0) {
          (*local_5b8)(&local_5c8,&local_5c8,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_520);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_508);
        lVar2 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(&local_610[0].id_ + lVar2));
          lVar2 = lVar2 + -0x18;
        } while (lVar2 != -0x18);
      }
      else {
        LogicalType::LogicalType(local_610,other);
        LogicalType::LogicalType(local_610 + 1,other);
        __l_01._M_len = 2;
        __l_01._M_array = local_610;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_538,__l_01,&local_621);
        LogicalType::LogicalType(&local_550,other);
        GetBinaryFunctionIgnoreZero<duckdb::ModuloOperator>
                  ((scalar_function_t *)&local_570,other->physical_type_);
        LogicalType::LogicalType(&local_4c0,INVALID);
        varargs_01.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_01._0_8_ = &local_4c0;
        varargs_01.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffff9c4;
        varargs_01.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_01.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffff9cc;
        ScalarFunction::ScalarFunction
                  (&local_458,(vector<duckdb::LogicalType,_true> *)&local_538,&local_550,
                   (scalar_function_t *)&local_570,(bind_scalar_function_t)0x0,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs_01,CONSISTENT,in_stack_fffffffffffff9d8,
                   (bind_lambda_function_t)in_RDI);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&this->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_458);
        local_458.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_01993078;
        if (local_458.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_458.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_458.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_458.function.super__Function_base._M_manager)
                    (local_5e0,local_5e0,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_458.super_BaseScalarFunction);
        LogicalType::~LogicalType(&local_4c0);
        if (local_560 != (code *)0x0) {
          (*local_560)(&local_570,&local_570,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_550);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_538);
        lVar2 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(&local_610[0].id_ + lVar2));
          lVar2 = lVar2 + -0x18;
        } while (lVar2 != -0x18);
      }
      other = other + 1;
    } while (other != local_588.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_588);
  function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
             super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function != pSVar1) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function = function + 1;
    } while (function != pSVar1);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet OperatorModuloFun::GetFunctions() {
	ScalarFunctionSet modulo("%");
	for (auto &type : LogicalType::Numeric()) {
		if (type.id() == LogicalTypeId::FLOAT || type.id() == LogicalTypeId::DOUBLE) {
			modulo.AddFunction(ScalarFunction({type, type}, type, nullptr, BindBinaryFloatingPoint<ModuloOperator>));
		} else if (type.id() == LogicalTypeId::DECIMAL) {
			modulo.AddFunction(ScalarFunction({type, type}, type, nullptr, BindDecimalModulo<ModuloOperator>));
		} else {
			modulo.AddFunction(
			    ScalarFunction({type, type}, type, GetBinaryFunctionIgnoreZero<ModuloOperator>(type.InternalType())));
		}
	}
	for (auto &func : modulo.functions) {
		ScalarFunction::SetReturnsError(func);
	}

	return modulo;
}